

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

void free_checkpoints(void)

{
  int local_c;
  int i;
  
  for (local_c = 0; local_c < cpcount; local_c = local_c + 1) {
    free_optlist(checkpoints[local_c].opt);
    mfree(&checkpoints[local_c].cpdata);
  }
  free(checkpoints);
  checkpoints = (replay_checkpoint *)0x0;
  cpcount = 0;
  return;
}

Assistant:

static void free_checkpoints(void)
{
    int i;
    
    for (i = 0; i < cpcount; i++) {
	free_optlist(checkpoints[i].opt);
	mfree(&(checkpoints[i].cpdata));
    }
    free(checkpoints);
    checkpoints = NULL;
    cpcount = 0;
}